

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

void * QArrayData::allocate2(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  AllocationResult AVar1;
  qsizetype unaff_retaddr;
  undefined4 in_stack_00000008;
  AllocationResult r;
  undefined8 local_18;
  undefined8 uStack_10;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  AVar1 = allocateHelper(capacity,CONCAT44(option,in_stack_00000008),unaff_retaddr,
                         (AllocationOption)((ulong)lVar2 >> 0x20));
  uStack_10 = AVar1.header;
  *in_RDI = uStack_10;
  local_18 = AVar1.data;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

void *QArrayData::allocate2(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(2, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}